

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxReporters.cpp
# Opt level: O0

void __thiscall
ApprovalTests::Linux::BeyondCompareReporter::BeyondCompareReporter(BeyondCompareReporter *this)

{
  DiffInfo *in_RDI;
  DiffInfo *in_stack_ffffffffffffffd8;
  GenericDiffReporter *in_stack_ffffffffffffffe0;
  
  DiffPrograms::Linux::BEYOND_COMPARE();
  GenericDiffReporter::GenericDiffReporter(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  DiffInfo::~DiffInfo(in_RDI);
  *(undefined ***)&in_RDI->program = &PTR__BeyondCompareReporter_002980f0;
  return;
}

Assistant:

BeyondCompareReporter::BeyondCompareReporter()
            : GenericDiffReporter(DiffPrograms::Linux::BEYOND_COMPARE())
        {
        }